

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_3)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  dxt5_endpoint_optimizer *this_00;
  results *r;
  ulong uVar5;
  uint *puVar6;
  byte *pbVar7;
  unsigned_long_long *puVar8;
  uint in_ESI;
  long in_RDI;
  float fVar9;
  uint i_4;
  results refinerResults;
  params refinerParams;
  uint error;
  int delta_1;
  uint8 s;
  uint8 t;
  uint8 s_best;
  uint error_best;
  uint p;
  uint64 selector;
  uint weight;
  uint b;
  uint i_3;
  vector<unsigned_int> *blocks;
  uint component_index;
  uint a;
  int i_2;
  int *modifier;
  int multiplier;
  int modifier_index;
  int base_codeword;
  uint i_1;
  uint endpoint_weight;
  uint encoding_weight [8];
  int delta;
  uint i;
  uint alpha_values [8];
  uint block_values [8];
  results results;
  params params;
  alpha_cluster *cluster;
  uint cluster_index;
  vector<unsigned_char> selectors;
  dxt_endpoint_refiner refiner;
  dxt5_endpoint_optimizer optimizer;
  uint num_tasks;
  undefined2 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92a;
  undefined1 in_stack_fffffffffffff92b;
  uint in_stack_fffffffffffff92c;
  dxt5_endpoint_optimizer *in_stack_fffffffffffff930;
  uchar *in_stack_fffffffffffff938;
  vector<unsigned_char> *in_stack_fffffffffffff940;
  uint local_6ac;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  uint uVar10;
  int local_668;
  undefined7 in_stack_fffffffffffff9c0;
  uint local_61c;
  ushort local_618;
  ushort local_616;
  params local_608;
  uint local_5cc;
  uint local_5c8;
  byte local_5c3;
  byte local_5c2;
  byte local_5c1;
  uint local_5c0;
  uint local_5bc;
  ulong local_5b8;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  vector<unsigned_int> *local_5a0;
  uint local_594;
  uint local_590;
  int local_58c;
  int (*local_588) [8];
  int local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  uint auStack_568 [10];
  int local_540;
  uint local_53c;
  int aiStack_538 [8];
  int local_518 [8];
  uchar *local_4f8;
  uint64 local_4f0;
  byte local_4e8;
  byte local_4e7;
  byte local_4e5;
  params local_4e0;
  dxt5_endpoint_optimizer *local_4c0;
  uint local_4b4;
  vector<unsigned_char> local_4b0 [2];
  results *in_stack_fffffffffffffb78;
  params *in_stack_fffffffffffffb80;
  dxt_endpoint_refiner *in_stack_fffffffffffffb88;
  
  uVar2 = task_pool::get_num_threads(*(task_pool **)(in_RDI + 0x898));
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
            ((dxt5_endpoint_optimizer *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  dxt_endpoint_refiner::dxt_endpoint_refiner((dxt_endpoint_refiner *)&stack0xfffffffffffffb70);
  vector<unsigned_char>::vector(local_4b0);
  for (local_4b4 = in_ESI; uVar10 = local_4b4,
      uVar3 = vector<crnlib::dxt_hc::alpha_cluster>::size
                        ((vector<crnlib::dxt_hc::alpha_cluster> *)(in_RDI + 0x878)), uVar10 < uVar3;
      local_4b4 = uVar2 + 1 + local_4b4) {
    this_00 = (dxt5_endpoint_optimizer *)
              vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                        ((vector<crnlib::dxt_hc::alpha_cluster> *)(in_RDI + 0x878),local_4b4);
    local_4c0 = this_00;
    uVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::empty
                      ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                       &this_00->m_trial_selectors);
    if (!(bool)uVar1) {
      dxt5_endpoint_optimizer::params::params(&local_4e0);
      r = (results *)
          vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                    ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                     &local_4c0->m_trial_selectors);
      local_4e0.m_pPixels = (color_quad_u8 *)r;
      local_4e0.m_num_pixels =
           vector<crnlib::color_quad<unsigned_char,_int>_>::size
                     ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                      &local_4c0->m_trial_selectors);
      local_4e0.m_comp_index = 0;
      local_4e0.m_quality = cCRNDXTQualityUber;
      local_4e0.m_use_both_block_types = false;
      vector<unsigned_char>::resize
                (in_stack_fffffffffffff940,(uint)((ulong)in_stack_fffffffffffff938 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff938 >> 0x18,0));
      local_4f8 = vector<unsigned_char>::get_ptr(local_4b0);
      dxt5_endpoint_optimizer::compute
                (this_00,(params *)CONCAT17(uVar1,in_stack_fffffffffffff9c0),r);
      *(uint *)&(local_4c0->m_best_selectors).m_p = (uint)local_4e8;
      *(uint *)((long)&(local_4c0->m_best_selectors).m_p + 4) = (uint)local_4e7;
      dxt5_block::get_block_values
                ((uint *)CONCAT44(in_stack_fffffffffffff92c,
                                  CONCAT13(in_stack_fffffffffffff92b,
                                           CONCAT12(in_stack_fffffffffffff92a,
                                                    in_stack_fffffffffffff928))),0,0x1f37ae);
      for (local_53c = 0; local_53c < 8; local_53c = local_53c + 1) {
        iVar4 = local_518[*(byte *)((long)&g_dxt5_from_linear + (ulong)local_53c)];
        local_4c0->m_unique_value_map[(ulong)local_53c - 2] = iVar4;
        aiStack_538[local_53c] = iVar4;
      }
      local_540 = *(uint *)&(local_4c0->m_best_selectors).m_p -
                  *(uint *)((long)&(local_4c0->m_best_selectors).m_p + 4);
      local_56c = math::clamp<unsigned_int>((uint)(local_540 * local_540) >> 3,1,0x800);
      for (local_570 = 0; local_570 < 8; local_570 = local_570 + 1) {
        uVar5 = (ulong)local_56c;
        fVar9 = math::lerp<float,float>(1.15,1.0,(float)local_570 / 7.0);
        auStack_568[local_570] = (uint)(long)((float)uVar5 * fVar9);
      }
      if ((*(byte *)(in_RDI + 0x865) & 1) != 0) {
        local_574 = (int)((uint)local_4e8 + (uint)local_4e7 + 1) >> 1;
        local_578 = 0xb;
        if (local_540 < 7) {
          local_578 = 0xd;
          local_668 = 1;
        }
        else {
          local_668 = math::clamp<int>((local_540 + 0xc) / 0x12,1,0xf);
        }
        local_57c = local_668;
        local_588 = determine_alpha_endpoint_codebook_task::stripped_modifier_table +
                    (int)(uint)(local_578 != 0xb);
        for (local_58c = 0; local_58c < 8; local_58c = local_58c + 1) {
          iVar4 = math::clamp<int>(local_574 + (*local_588)[local_58c] * local_57c,0,0xff);
          local_4c0->m_unique_value_map[(long)local_58c + -2] = iVar4;
          aiStack_538[local_58c] = iVar4;
        }
        *(uint *)&(local_4c0->m_best_selectors).m_p = local_574;
        *(uint *)((long)&(local_4c0->m_best_selectors).m_p + 4) = local_57c << 4 | local_578;
      }
      for (local_590 = 0; local_590 < *(uint *)(in_RDI + 0x860); local_590 = local_590 + 1) {
        local_594 = *(uint *)(in_RDI + 0x838 + (ulong)local_590 * 4);
        local_5a0 = (vector<unsigned_int> *)
                    (local_4c0->m_unique_value_map + (ulong)(local_590 + 1) * 4 + -0x14);
        for (local_5a4 = 0; uVar10 = local_5a4, uVar3 = vector<unsigned_int>::size(local_5a0),
            uVar10 < uVar3; local_5a4 = local_5a4 + 1) {
          puVar6 = vector<unsigned_int>::operator[](local_5a0,local_5a4);
          local_5a8 = *puVar6;
          pbVar7 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)(in_RDI + 0x658),local_5a8);
          local_5ac = auStack_568[*pbVar7];
          local_5b8 = 0;
          for (local_5bc = 0; local_5bc < 0x10; local_5bc = local_5bc + 1) {
            local_5c0 = 0xffffffff;
            local_5c1 = 0;
            for (local_5c2 = 0; local_5c2 < 8; local_5c2 = local_5c2 + 1) {
              local_5c3 = local_5c2;
              if ((*(byte *)(in_RDI + 0x865) & 1) == 0) {
                if ((local_4e5 & 1) == 0) {
                  local_5c3 = *(byte *)((long)&g_dxt5_to_linear + (ulong)local_5c2);
                }
                else {
                  local_5c3 = 7 - *(char *)((long)&g_dxt5_to_linear + (ulong)local_5c2);
                }
              }
              uVar10 = local_5a8;
              if ((*(byte *)(in_RDI + 0x866) & 1) != 0) {
                uVar10 = local_5a8 >> 1;
              }
              pbVar7 = color_quad<unsigned_char,_int>::operator[]
                                 ((color_quad<unsigned_char,_int> *)
                                  (*(long *)(in_RDI + 0x638) + (ulong)uVar10 * 0x40 +
                                  (ulong)local_5bc * 4),local_594);
              local_5c8 = (uint)*pbVar7 - aiStack_538[local_5c3];
              local_6ac = local_5c8;
              if ((int)local_5c8 < 0) {
                local_6ac = -local_5c8;
              }
              local_5cc = local_6ac;
              if (local_6ac < local_5c0) {
                local_5c1 = local_5c3;
                local_5c0 = local_6ac;
              }
            }
            local_5b8 = local_5b8 << 3 | (ulong)local_5c1;
          }
          in_stack_fffffffffffff940 =
               (vector<unsigned_char> *)(local_5b8 << 0x10 | (ulong)local_5ac);
          puVar8 = vector<unsigned_long_long>::operator[]
                             ((vector<unsigned_long_long> *)
                              (in_RDI + 0x668 + (ulong)(local_590 + 1) * 0x10),local_5a8);
          *puVar8 = (unsigned_long_long)in_stack_fffffffffffff940;
        }
      }
      dxt_endpoint_refiner::params::params(&local_608);
      local_608.m_perceptual = (bool)(*(byte *)(in_RDI + 0x818) & 1);
      in_stack_fffffffffffff938 = vector<unsigned_char>::get_ptr(local_4b0);
      local_608.m_pSelectors = in_stack_fffffffffffff938;
      in_stack_fffffffffffff930 =
           (dxt5_endpoint_optimizer *)
           vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                     ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                      &local_4c0->m_trial_selectors);
      local_608.m_pPixels = (color_quad_u8 *)in_stack_fffffffffffff930;
      in_stack_fffffffffffff92c =
           vector<crnlib::color_quad<unsigned_char,_int>_>::size
                     ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                      &local_4c0->m_trial_selectors);
      local_608.m_dxt1_selectors = false;
      local_608.m_error_to_beat = local_4f0;
      local_608.m_block_index = local_4b4;
      in_stack_fffffffffffff92b = false;
      local_608.m_num_pixels = in_stack_fffffffffffff92c;
      if ((*(byte *)(in_RDI + 0x865) & 1) == 0) {
        in_stack_fffffffffffff92a =
             dxt_endpoint_refiner::refine
                       (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                        in_stack_fffffffffffffb78);
        in_stack_fffffffffffff92b = in_stack_fffffffffffff92a;
      }
      *(undefined1 *)(local_4c0->m_unique_value_map + 6) = in_stack_fffffffffffff92b;
      if ((*(bool *)(local_4c0->m_unique_value_map + 6) & 1U) == 0) {
        *(undefined8 *)(local_4c0->m_unique_value_map + 7) =
             *(undefined8 *)&(local_4c0->m_best_selectors).m_size;
        *(undefined8 *)(local_4c0->m_unique_value_map + 9) =
             *(undefined8 *)local_4c0->m_unique_value_map;
        *(undefined8 *)(local_4c0->m_unique_value_map + 0xb) =
             *(undefined8 *)(local_4c0->m_unique_value_map + 2);
        *(undefined8 *)(local_4c0->m_unique_value_map + 0xd) =
             *(undefined8 *)(local_4c0->m_unique_value_map + 4);
      }
      else {
        *(uint *)&(local_4c0->m_best_selectors).m_p = (uint)local_618;
        *(uint *)((long)&(local_4c0->m_best_selectors).m_p + 4) = (uint)local_616;
        dxt5_block::get_block_values
                  ((uint *)CONCAT44(in_stack_fffffffffffff92c,
                                    CONCAT13(in_stack_fffffffffffff92b,
                                             CONCAT12(in_stack_fffffffffffff92a,
                                                      in_stack_fffffffffffff928))),0,0x1f3f5e);
        for (local_61c = 0; local_61c < 8; local_61c = local_61c + 1) {
          local_4c0->m_unique_value_map[(ulong)local_61c + 7] =
               local_518[*(byte *)((long)&g_dxt5_from_linear + (ulong)local_61c)];
        }
      }
    }
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffff930);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(in_stack_fffffffffffff930);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}